

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O1

PHYSFS_Io * doOpen(void *opaque,char *name,int mode)

{
  PHYSFS_ErrorCode errcode;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  PHYSFS_Io *pPVar4;
  undefined1 *puVar5;
  undefined1 *ptr;
  ulong len;
  undefined1 local_58 [8];
  PHYSFS_Stat statbuf;
  
  puVar5 = local_58;
  if (opaque == (void *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen((char *)opaque);
  }
  sVar2 = strlen(name);
  len = sVar2 + sVar1 + 1;
  if (len < 0x100) {
    puVar5 = local_58 + -(sVar2 + sVar1 + 0x18 & 0xfffffffffffffff0);
    ptr = puVar5;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)(puVar5 + -8) = 0x10cdfb;
  pcVar3 = (char *)__PHYSFS_initSmallAlloc(ptr,len);
  *(undefined8 *)(puVar5 + -8) = 0x10ce0c;
  pcVar3 = cvtToDependent((char *)opaque,name,pcVar3,len);
  if (pcVar3 == (char *)0x0) {
    pPVar4 = (PHYSFS_Io *)0x0;
  }
  else {
    *(undefined8 *)(puVar5 + -8) = 0x10ce1e;
    pPVar4 = __PHYSFS_createNativeIo(pcVar3,mode);
    if (pPVar4 == (PHYSFS_Io *)0x0) {
      *(undefined8 *)(puVar5 + -8) = 0x10ce2b;
      errcode = PHYSFS_getLastErrorCode();
      *(undefined8 *)(puVar5 + -8) = 0x10ce3c;
      __PHYSFS_platformStat(pcVar3,(PHYSFS_Stat *)local_58,0);
      *(undefined8 *)(puVar5 + -8) = 0x10ce44;
      PHYSFS_setErrorCode(errcode);
    }
    *(undefined8 *)(puVar5 + -8) = 0x10ce4c;
    __PHYSFS_smallFree(pcVar3);
  }
  return pPVar4;
}

Assistant:

static PHYSFS_Io *doOpen(void *opaque, const char *name, const int mode)
{
    PHYSFS_Io *io = NULL;
    char *f = NULL;

    CVT_TO_DEPENDENT(f, opaque, name);
    BAIL_IF_ERRPASS(!f, NULL);

    io = __PHYSFS_createNativeIo(f, mode);
    if (io == NULL)
    {
        const PHYSFS_ErrorCode err = PHYSFS_getLastErrorCode();
        PHYSFS_Stat statbuf;
        __PHYSFS_platformStat(f, &statbuf, 0);  /* !!! FIXME: why are we stating here? */
        PHYSFS_setErrorCode(err);
    } /* if */

    __PHYSFS_smallFree(f);

    return io;
}